

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O0

connectdata * find_oldest_idle_connection_in_bundle(SessionHandle *data,connectbundle *bundle)

{
  connectdata *pcVar1;
  long lVar2;
  timeval newer;
  connectdata *conn;
  connectdata *conn_candidate;
  timeval now;
  long score;
  long highscore;
  curl_llist_element *curr;
  connectbundle *bundle_local;
  SessionHandle *data_local;
  
  score = -1;
  conn = (connectdata *)0x0;
  newer = curlx_tvnow();
  for (highscore = (long)bundle->conn_list->head; highscore != 0;
      highscore = *(long *)(highscore + 0x10)) {
    pcVar1 = *(connectdata **)highscore;
    if (((pcVar1->inuse & 1U) == 0) && (lVar2 = curlx_tvdiff(newer,pcVar1->now), score < lVar2)) {
      conn = pcVar1;
      score = lVar2;
    }
  }
  return conn;
}

Assistant:

static struct connectdata *
find_oldest_idle_connection_in_bundle(struct SessionHandle *data,
                                      struct connectbundle *bundle)
{
  struct curl_llist_element *curr;
  long highscore=-1;
  long score;
  struct timeval now;
  struct connectdata *conn_candidate = NULL;
  struct connectdata *conn;

  (void)data;

  now = Curl_tvnow();

  curr = bundle->conn_list->head;
  while(curr) {
    conn = curr->ptr;

    if(!conn->inuse) {
      /* Set higher score for the age passed since the connection was used */
      score = Curl_tvdiff(now, conn->now);

      if(score > highscore) {
        highscore = score;
        conn_candidate = conn;
      }
    }
    curr = curr->next;
  }

  return conn_candidate;
}